

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void set_txfm_context(MACROBLOCKD *xd,TX_SIZE tx_size,int blk_row,int blk_col)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  TXFM_CONTEXT *pTVar5;
  TXFM_CONTEXT *pTVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  
  pMVar4 = *xd->mi;
  BVar1 = pMVar4->bsize;
  uVar11 = (uint)block_size_high[BVar1];
  if (xd->mb_to_bottom_edge < 0) {
    uVar11 = (uint)block_size_high[BVar1] +
             (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar9 = (uint)block_size_wide[BVar1];
  if (xd->mb_to_right_edge < 0) {
    uVar9 = (uint)block_size_wide[BVar1] +
            (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f));
  }
  iVar12 = ((int)uVar11 >> 2) - blk_row;
  if ((iVar12 != 0 && blk_row <= (int)uVar11 >> 2) &&
     (iVar10 = ((int)uVar9 >> 2) - blk_col, iVar10 != 0 && blk_col <= (int)uVar9 >> 2)) {
    iVar8 = (blk_col >> (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
            ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
            (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f));
    if (pMVar4->inter_tx_size[iVar8] == tx_size) {
      pMVar4->tx_size = tx_size;
      pTVar5 = xd->above_txfm_context;
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [txsize_to_bsize[tx_size]];
      iVar12 = tx_size_wide[tx_size];
      memset(xd->left_txfm_context + blk_row,tx_size_high[tx_size],
             (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [txsize_to_bsize[tx_size]] +
                     (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [txsize_to_bsize[tx_size]] == 0) & 0xff));
      memset(pTVar5 + blk_col,iVar12,(ulong)((uint)bVar2 + (uint)(bVar2 == 0) & 0xff));
      return;
    }
    if (tx_size == '\x01') {
      pMVar4->inter_tx_size[iVar8] = '\0';
      pMVar4->tx_size = '\0';
      pTVar5 = xd->above_txfm_context;
      pTVar6 = xd->left_txfm_context;
      (pTVar6 + blk_row)[0] = '\x04';
      (pTVar6 + blk_row)[1] = '\x04';
      (pTVar5 + blk_col)[0] = '\x04';
      (pTVar5 + blk_col)[1] = '\x04';
    }
    else {
      iVar8 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (iVar8 < iVar12) {
        iVar12 = iVar8;
      }
      iVar8 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      if (iVar8 < iVar10) {
        iVar10 = iVar8;
      }
      if (0 < iVar12) {
        bVar2 = ""[tx_size];
        iVar8 = tx_size_wide_unit[bVar2];
        iVar3 = tx_size_high_unit[bVar2];
        iVar7 = 0;
        do {
          if (0 < iVar10) {
            iVar13 = 0;
            do {
              set_txfm_context(xd,bVar2,blk_row + iVar7,blk_col + iVar13);
              iVar13 = iVar13 + iVar8;
            } while (iVar13 < iVar10);
          }
          iVar7 = iVar7 + iVar3;
        } while (iVar7 < iVar12);
      }
    }
  }
  return;
}

Assistant:

static void set_txfm_context(MACROBLOCKD *xd, TX_SIZE tx_size, int blk_row,
                             int blk_col) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size) {
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);

  } else {
    if (tx_size == TX_8X8) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;
        set_txfm_context(xd, sub_txs, offsetr, offsetc);
      }
    }
  }
}